

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

void __thiscall Logger::~Logger(Logger *this)

{
  Buffer *msg;
  
  LogStream::operator<<((LogStream *)this,"\n+-----------------------+\n");
  msg = &(this->impl_).stream_.buffer_;
  output(msg->data_,*(int *)&(this->impl_).stream_.buffer_.cur_ - (int)msg);
  std::__cxx11::string::~string((string *)&(this->impl_).basename_);
  return;
}

Assistant:

Logger::~Logger()
{
    //printf("Class Logger num:%d Deleted!\n",ClassNum_);
    impl_.stream_ << "\n+-----------------------+\n";
    //impl_.stream_ << " -- " << impl_.basename_ << ':' << impl_.line_ << '\n';
    //impl_.stream_ << "-------------------------\n";

    const LogStream::Buffer& buf(stream().buffer());
    output(buf.data(), buf.length());
}